

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O2

bool __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::CheckState
          (TextureBase<Diligent::EngineVkImplTraits> *this,RESOURCE_STATE State)

{
  RESOURCE_STATE RVar1;
  string msg;
  string local_38;
  
  if ((State & State - RESOURCE_STATE_UNDEFINED) != RESOURCE_STATE_UNKNOWN) {
    FormatString<char[25]>(&local_38,(char (*) [25])"Single state is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x137);
    std::__cxx11::string::~string((string *)&local_38);
  }
  RVar1 = this->m_State;
  if (RVar1 == RESOURCE_STATE_UNKNOWN) {
    FormatString<char[25]>(&local_38,(char (*) [25])"Texture state is unknown");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x138);
    std::__cxx11::string::~string((string *)&local_38);
    RVar1 = this->m_State;
  }
  return (State & ~RVar1) == RESOURCE_STATE_UNKNOWN;
}

Assistant:

bool CheckState(RESOURCE_STATE State) const
    {
        VERIFY((State & (State - 1)) == 0, "Single state is expected");
        VERIFY(IsInKnownState(), "Texture state is unknown");
        return (this->m_State & State) == State;
    }